

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.cpp
# Opt level: O1

Float pbrt::Turbulence(Point3f p,Vector3f dpdx,Vector3f dpdy,Float omega,int maxOctaves)

{
  undefined8 uVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  undefined8 in_XMM0_Qb;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 uVar12;
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  float fVar19;
  undefined1 auVar20 [16];
  float in_XMM2_Dd;
  float in_XMM4_Dd;
  undefined1 auVar21 [64];
  undefined1 in_register_000013c4 [12];
  undefined1 local_58 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  auVar21._4_60_ = dpdy._12_60_;
  auVar21._0_4_ = dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar18._4_60_ = dpdx._12_60_;
  auVar18._0_4_ = dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar8._0_4_ = dpdx.super_Tuple3<pbrt::Vector3,_float>.x *
                 dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar8._4_4_ = dpdx.super_Tuple3<pbrt::Vector3,_float>.y *
                 dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar8._8_4_ = 0;
  auVar8._12_4_ = in_XMM2_Dd * in_XMM2_Dd;
  auVar20._0_4_ =
       dpdy.super_Tuple3<pbrt::Vector3,_float>.x * dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar20._4_4_ =
       dpdy.super_Tuple3<pbrt::Vector3,_float>.y * dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar20._8_4_ = 0;
  auVar20._12_4_ = in_XMM4_Dd * in_XMM4_Dd;
  auVar10 = vhaddps_avx(auVar8,auVar20);
  auVar8 = vinsertps_avx(auVar18._0_16_,auVar21._0_16_,0x10);
  auVar10 = vshufps_avx(auVar10,auVar10,0xe8);
  auVar13._0_4_ = auVar8._0_4_ * auVar8._0_4_ + auVar10._0_4_;
  auVar13._4_4_ = auVar8._4_4_ * auVar8._4_4_ + auVar10._4_4_;
  auVar13._8_4_ = auVar8._8_4_ * auVar8._8_4_ + auVar10._8_4_;
  auVar13._12_4_ = auVar8._12_4_ * auVar8._12_4_ + auVar10._12_4_;
  auVar10 = vmovshdup_avx(auVar13);
  auVar10 = vmaxss_avx(auVar10,auVar13);
  fVar11 = logf(auVar10._0_4_);
  auVar5._8_8_ = in_XMM0_Qb;
  auVar5._0_8_ = p.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar8 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf000000),0),ZEXT416((uint)(fVar11 * 1.442695)),
                           ZEXT416(0xbf800000));
  auVar14._0_4_ = (float)maxOctaves;
  auVar14._4_12_ = in_register_000013c4;
  auVar10 = vminss_avx(auVar14,auVar8);
  uVar12 = vcmpss_avx512f(auVar8,ZEXT816(0),1);
  fVar2 = (float)((uint)!(bool)((byte)uVar12 & 1) * auVar10._0_4_);
  auVar10._0_4_ = fVar2;
  auVar10 = vroundss_avx(auVar10,auVar10,9);
  iVar6 = (int)auVar10._0_4_;
  fVar19 = 1.0;
  auVar10 = vmovshdup_avx(auVar5);
  fVar11 = 1.0;
  local_58._0_8_ = 0;
  local_58._8_8_ = 0;
  uVar12 = 0;
  if (0 < iVar6) {
    fVar19 = 1.0;
    iVar7 = iVar6;
    fVar11 = fVar19;
    do {
      auVar16._0_4_ =
           Noise(p.super_Tuple3<pbrt::Point3,_float>.x * fVar11,auVar10._0_4_ * fVar11,
                 fVar11 * p.super_Tuple3<pbrt::Point3,_float>.z);
      auVar16._4_60_ = extraout_var;
      auVar3._8_4_ = 0x7fffffff;
      auVar3._0_8_ = 0x7fffffff7fffffff;
      auVar3._12_4_ = 0x7fffffff;
      auVar8 = vandps_avx512vl(auVar16._0_16_,auVar3);
      auVar8 = vfmadd231ss_fma(local_58,ZEXT416((uint)fVar19),auVar8);
      local_58._8_8_ = auVar8._8_8_;
      local_58._0_8_ = auVar8._0_8_;
      fVar11 = fVar11 * 1.99;
      fVar19 = fVar19 * omega;
      iVar7 = iVar7 + -1;
      uVar12 = local_58._0_8_;
    } while (iVar7 != 0);
  }
  auVar15._0_4_ = ((fVar2 - (float)iVar6) + -0.3) / 0.39999998;
  auVar15._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar8 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar15);
  uVar1 = vcmpss_avx512f(auVar15,ZEXT816(0) << 0x20,1);
  fVar2 = (float)((uint)!(bool)((byte)uVar1 & 1) * auVar8._0_4_);
  auVar9._4_12_ = auVar8._4_12_;
  auVar9._0_4_ = fVar2;
  auVar8 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar9,ZEXT416(0x40400000));
  fVar2 = fVar2 * fVar2 * auVar8._0_4_;
  auVar17._0_4_ =
       Noise(p.super_Tuple3<pbrt::Point3,_float>.x * fVar11,auVar10._0_4_ * fVar11,
             fVar11 * p.super_Tuple3<pbrt::Point3,_float>.z);
  auVar17._4_60_ = extraout_var_00;
  auVar4._8_4_ = 0x7fffffff;
  auVar4._0_8_ = 0x7fffffff7fffffff;
  auVar4._12_4_ = 0x7fffffff;
  auVar10 = vandps_avx512vl(auVar17._0_16_,auVar4);
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * auVar10._0_4_)),ZEXT416((uint)(1.0 - fVar2)),
                            ZEXT416(0x3e4ccccd));
  local_58._0_4_ = (undefined4)uVar12;
  auVar10 = vfmadd213ss_fma(auVar10,ZEXT416((uint)fVar19),ZEXT416((uint)local_58._0_4_));
  auVar18 = ZEXT1664(auVar10);
  iVar7 = maxOctaves - iVar6;
  if (iVar7 != 0 && iVar6 <= maxOctaves) {
    do {
      auVar10 = vfmadd231ss_fma(auVar18._0_16_,ZEXT416((uint)fVar19),SUB6416(ZEXT464(0x3e4ccccd),0))
      ;
      auVar18 = ZEXT1664(auVar10);
      fVar19 = fVar19 * omega;
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
  }
  return auVar18._0_4_;
}

Assistant:

Float Turbulence(Point3f p, Vector3f dpdx, Vector3f dpdy, Float omega, int maxOctaves) {
    // Compute number of octaves for antialiased FBm
    Float len2 = std::max(LengthSquared(dpdx), LengthSquared(dpdy));
    Float n = Clamp(-1 - .5f * Log2(len2), 0, maxOctaves);
    int nInt = std::floor(n);

    // Compute sum of octaves of noise for turbulence
    Float sum = 0, lambda = 1, o = 1;
    for (int i = 0; i < nInt; ++i) {
        sum += o * std::abs(Noise(lambda * p));
        lambda *= 1.99f;
        o *= omega;
    }

    // Account for contributions of clamped octaves in turbulence
    Float nPartial = n - nInt;
    sum += o * Lerp(SmoothStep(nPartial, .3f, .7f), 0.2, std::abs(Noise(lambda * p)));
    for (int i = nInt; i < maxOctaves; ++i) {
        sum += o * 0.2f;
        o *= omega;
    }

    return sum;
}